

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTricycle.cpp
# Opt level: O2

int __thiscall CTestTricycle::CreateResultFiles(CTestTricycle *this)

{
  ostream *poVar1;
  
  std::ofstream::open((string *)&this->m_fsFilePose,(int)this + (_S_trunc|_S_out));
  poVar1 = std::operator<<((ostream *)&this->m_fsFilePose,"#time\t");
  poVar1 = std::operator<<(poVar1,"robot_x\t");
  poVar1 = std::operator<<(poVar1,"robot_y\t");
  poVar1 = std::operator<<(poVar1,"robot_q");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::open((string *)&this->m_fsFileContour,(int)this + 0x50);
  poVar1 = std::operator<<((ostream *)&this->m_fsFileContour,"#robot_x\t");
  poVar1 = std::operator<<(poVar1,"robot_y\t");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"#LWheel_x\t");
  poVar1 = std::operator<<(poVar1,"LWheel_y\t");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"#FWheel_x\t");
  poVar1 = std::operator<<(poVar1,"FWheel_y\t");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"#RWheel_x\t");
  poVar1 = std::operator<<(poVar1,"RWheel_y\t");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"#robot_x\t");
  poVar1 = std::operator<<(poVar1,"robot_y");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int CTestTricycle::CreateResultFiles()
{
	/// create a file to save poses of robot center (trajectory)
	m_fsFilePose.open(m_sFilenamePose);

	/// write comment (attribute of each field)
	m_fsFilePose << "#time\t" \
		<< "robot_x\t"  << "robot_y\t"  << "robot_q" << std::endl;

	/// create a file to save polygon shapes of the robot
	m_fsFileContour.open(m_sFilenameContour);

	/// write 1st line comment
	m_fsFileContour << "#robot_x\t" << "robot_y\t" << std::endl \
		<< "#LWheel_x\t" << "LWheel_y\t" << std::endl \
		<< "#FWheel_x\t" << "FWheel_y\t" << std::endl \
		<< "#RWheel_x\t" << "RWheel_y\t" << std::endl \
		<< "#robot_x\t" << "robot_y" << std::endl << std::endl;

	// no errors
	return 0;
}